

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::LightBVHNode::ToString_abi_cxx11_(string *__return_storage_ptr__,LightBVHNode *this)

{
  uint *in_R9;
  uint local_10;
  OctahedralVector local_c;
  
  local_c = (OctahedralVector)((uint)this->field_1 & 0x7fffffff);
  local_10 = (uint)this->field_1 >> 0x1f;
  StringPrintf<pbrt::CompactLightBounds_const&,unsigned_int_const&,unsigned_int_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ LightBVHNode lightBounds: %s childOrLightIndex: %d isLeaf: %d ]",
             (char *)this,(CompactLightBounds *)&stack0xfffffffffffffff4,&local_10,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string LightBVHNode::ToString() const {
    return StringPrintf(
        "[ LightBVHNode lightBounds: %s childOrLightIndex: %d isLeaf: %d ]", lightBounds,
        childOrLightIndex, isLeaf);
}